

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O0

HighsStatus
formSimplexLpBasisAndFactor(HighsLpSolverObject *solver_object,bool only_from_known_basis)

{
  byte *pbVar1;
  long lVar2;
  HighsStatus HVar3;
  HighsStatus HVar4;
  long in_RDI;
  HighsStatus call_status_1;
  bool check_basis;
  bool new_scaling;
  HighsSimplexStatus *ekk_status;
  HEkk *ekk_instance;
  HighsOptions *options;
  HighsBasis *basis;
  HighsLp *lp;
  HighsStatus call_status;
  HighsStatus return_status;
  HighsLpSolverObject *in_stack_00000700;
  HighsLogOptions *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  HighsStatus in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  HEkk *in_stack_ffffffffffffff10;
  allocator *paVar5;
  byte local_e6;
  byte local_e5;
  allocator local_d1;
  HighsLp *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  HighsStatus in_stack_ffffffffffffff48;
  HighsStatus in_stack_ffffffffffffff4c;
  HighsLogOptions *in_stack_ffffffffffffff50;
  HEkk *in_stack_ffffffffffffff58;
  HighsStatus local_4;
  
  pbVar1 = *(byte **)(in_RDI + 8);
  lVar2 = *(long *)(in_RDI + 0x20);
  HighsLp::ensureColwise((HighsLp *)0x528c78);
  considerScaling((HighsOptions *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                  (HighsLp *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  local_e5 = 1;
  if ((pbVar1[1] & 1) == 0) {
    local_e6 = 0;
    if ((*pbVar1 & 1) == 0) {
      local_e6 = pbVar1[2];
    }
    local_e5 = local_e6;
  }
  if ((local_e5 & 1) == 0) {
    HEkk::moveLp(in_stack_ffffffffffffff10,
                 (HighsLpSolverObject *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    HVar4 = (HighsStatus)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    if ((*(byte *)(lVar2 + 0x2554) & 1) == 0) {
      in_stack_ffffffffffffff08 =
           HEkk::setBasis(in_stack_ffffffffffffff58,(HighsBasis *)in_stack_ffffffffffffff50);
      HighsLogOptions::HighsLogOptions
                ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff0c = 0;
      paVar5 = &local_d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffff30,"setBasis",paVar5);
      HVar4 = (HighsStatus)((ulong)paVar5 >> 0x20);
      HVar3 = interpretCallStatus(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                                  in_stack_ffffffffffffff48,
                                  (string *)
                                  CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x528e0c);
      if (HVar3 == kError) {
        HVar4 = formSimplexLpBasisAndFactorReturn
                          (HVar4,(HighsLpSolverObject *)
                                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        return HVar4;
      }
    }
    HVar3 = HEkk::initialiseSimplexLpBasisAndFactor
                      ((HEkk *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       (bool)in_stack_ffffffffffffff47);
    if (HVar3 == kOk) {
      local_4 = formSimplexLpBasisAndFactorReturn
                          (HVar4,(HighsLpSolverObject *)
                                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
    else {
      local_4 = formSimplexLpBasisAndFactorReturn
                          (HVar4,(HighsLpSolverObject *)
                                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
  }
  else {
    pbVar1[1] = 1;
    accommodateAlienBasis(in_stack_00000700);
    pbVar1[1] = 0;
    HighsLp::unapplyScale(in_stack_ffffffffffffff30);
    local_4 = kOk;
  }
  return local_4;
}

Assistant:

HighsStatus formSimplexLpBasisAndFactor(HighsLpSolverObject& solver_object,
                                        const bool only_from_known_basis) {
  // Ideally, forms a SimplexBasis from the HighsBasis in the
  // HighsLpSolverObject
  //
  // If only_from_known_basis is true and
  // initialiseSimplexLpBasisAndFactor finds that there is no simplex
  // basis, then its error return is passed down
  //
  // If only_from_known_basis is false, then the basis is completed
  // with logicals if it is rank deficient (from singularity or being
  // incomplete)
  //
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;
  HighsLp& lp = solver_object.lp_;
  HighsBasis& basis = solver_object.basis_;
  HighsOptions& options = solver_object.options_;
  HEkk& ekk_instance = solver_object.ekk_instance_;
  HighsSimplexStatus& ekk_status = ekk_instance.status_;
  lp.ensureColwise();
  // Consider scaling the LP
  const bool new_scaling = considerScaling(options, lp);
  const bool check_basis = basis.alien || (!basis.valid && basis.useful);
  if (check_basis) {
    // The basis needs to be checked for rank deficiency, and possibly
    // completed if it is rectangular
    //
    // If it's not valid but useful, but not alien,
    // accommodateAlienBasis will assert, so make the basis alien
    basis.alien = true;
    assert(!only_from_known_basis);
    accommodateAlienBasis(solver_object);
    basis.alien = false;
    lp.unapplyScale();
    return HighsStatus::kOk;
  }
  // Move the HighsLpSolverObject's LP to EKK
  ekk_instance.moveLp(solver_object);
  if (!ekk_status.has_basis) {
    // The Ekk instance has no simplex basis, so pass the HiGHS basis
    HighsStatus call_status = ekk_instance.setBasis(basis);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "setBasis");
    if (return_status == HighsStatus::kError)
      return formSimplexLpBasisAndFactorReturn(return_status, solver_object);
  }
  // Now form the invert
  assert(ekk_status.has_basis);
  call_status =
      ekk_instance.initialiseSimplexLpBasisAndFactor(only_from_known_basis);
  // If the current basis cannot be inverted, return an error
  if (call_status != HighsStatus::kOk)
    return formSimplexLpBasisAndFactorReturn(HighsStatus::kError,
                                             solver_object);
  // Once the invert is formed, move back the LP and remove any scaling.
  return formSimplexLpBasisAndFactorReturn(HighsStatus::kOk, solver_object);
}